

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O3

bool __thiscall
bssl::ssl_is_alpn_protocol_allowed(bssl *this,SSL_HANDSHAKE *hs,Span<const_unsigned_char> protocol)

{
  size_t sVar1;
  bool bVar2;
  Span<const_unsigned_char> protocol_00;
  Span<const_unsigned_char> list;
  
  sVar1 = *(size_t *)(*(long *)(this + 8) + 0xa0);
  if (sVar1 == 0) {
    bVar2 = false;
  }
  else {
    bVar2 = true;
    if ((*(byte *)(*(long *)(*(long *)this + 0x68) + 0x288) & 0x80) == 0) {
      protocol_00.size_ = (size_t)protocol.data_;
      protocol_00.data_ = (uchar *)hs;
      list.size_ = sVar1;
      list.data_ = *(uchar **)(*(long *)(this + 8) + 0x98);
      bVar2 = ssl_alpn_list_contains_protocol(list,protocol_00);
      return bVar2;
    }
  }
  return bVar2;
}

Assistant:

bool ssl_is_alpn_protocol_allowed(const SSL_HANDSHAKE *hs,
                                  Span<const uint8_t> protocol) {
  if (hs->config->alpn_client_proto_list.empty()) {
    return false;
  }

  if (hs->ssl->ctx->allow_unknown_alpn_protos) {
    return true;
  }

  // Check that the protocol name is one of the ones we advertised.
  return ssl_alpn_list_contains_protocol(hs->config->alpn_client_proto_list,
                                         protocol);
}